

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

state ** State_arrayof(void)

{
  int iVar1;
  int local_1c;
  int size;
  int i;
  state **array;
  
  if (x3a == (s_x3 *)0x0) {
    array = (state **)0x0;
  }
  else {
    iVar1 = x3a->count;
    array = (state **)calloc((long)iVar1,8);
    if (array != (state **)0x0) {
      for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
        array[local_1c] = x3a->tbl[local_1c].data;
      }
    }
  }
  return array;
}

Assistant:

struct state **State_arrayof()
{
  struct state **array;
  int i,size;
  if( x3a==0 ) return 0;
  size = x3a->count;
  array = (struct state **)calloc(size, sizeof(struct state *));
  if( array ){
    for(i=0; i<size; i++) array[i] = x3a->tbl[i].data;
  }
  return array;
}